

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

void __thiscall cnn::ComputationGraph::clear(ComputationGraph *this)

{
  pointer pVVar1;
  pointer ppNVar2;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *__range1;
  pointer ppNVar3;
  
  pVVar1 = (this->parameter_nodes).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->parameter_nodes).
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->parameter_nodes).
    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  ppNVar2 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar3 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppNVar3 != ppNVar2; ppNVar3 = ppNVar3 + 1) {
    if (*ppNVar3 != (Node *)0x0) {
      (*(*ppNVar3)->_vptr_Node[1])();
    }
  }
  ppNVar3 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar3;
  }
  return;
}

Assistant:

void ComputationGraph::clear() {
  parameter_nodes.clear();
  for (auto n : nodes) delete n;
  nodes.clear();
}